

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.cc
# Opt level: O0

void __thiscall
wabt::MemoryStream::MemoryStream
          (MemoryStream *this,
          unique_ptr<wabt::OutputBuffer,_std::default_delete<wabt::OutputBuffer>_> *buf,
          Stream *log_stream)

{
  Stream *log_stream_local;
  unique_ptr<wabt::OutputBuffer,_std::default_delete<wabt::OutputBuffer>_> *buf_local;
  MemoryStream *this_local;
  
  Stream::Stream(&this->super_Stream,log_stream);
  (this->super_Stream)._vptr_Stream = (_func_int **)&PTR__MemoryStream_0036c3f0;
  std::unique_ptr<wabt::OutputBuffer,_std::default_delete<wabt::OutputBuffer>_>::unique_ptr
            (&this->buf_,buf);
  return;
}

Assistant:

MemoryStream::MemoryStream(std::unique_ptr<OutputBuffer>&& buf,
                           Stream* log_stream)
    : Stream(log_stream), buf_(std::move(buf)) {}